

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_hash.c
# Opt level: O0

lzma_ret lzma_index_hash_decode
                   (lzma_index_hash *index_hash,uint8_t *in,size_t *in_pos,size_t in_size)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  lzma_ret lVar4;
  int iVar5;
  uint32_t uVar6;
  lzma_vli lVar7;
  ulong uVar8;
  anon_enum_32 aVar9;
  lzma_vli *local_60;
  lzma_ret ret_;
  lzma_vli *size;
  lzma_ret ret;
  size_t in_start;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_index_hash *index_hash_local;
  
  if (in_size <= *in_pos) {
    return LZMA_BUF_ERROR;
  }
  sVar2 = *in_pos;
  do {
    size._4_4_ = LZMA_OK;
    if (in_size <= *in_pos) goto LAB_0024650f;
    switch(index_hash->sequence) {
    case SEQ_BLOCK:
      sVar3 = *in_pos;
      *in_pos = sVar3 + 1;
      if (in[sVar3] != '\0') {
        return LZMA_DATA_ERROR;
      }
      index_hash->sequence = SEQ_COUNT;
      break;
    case SEQ_COUNT:
      size._4_4_ = lzma_vli_decode(&index_hash->remaining,&index_hash->pos,in,in_pos,in_size);
      if (size._4_4_ != LZMA_STREAM_END) goto LAB_0024650f;
      if (index_hash->remaining != (index_hash->blocks).count) {
        return LZMA_DATA_ERROR;
      }
      index_hash->pos = 0;
      aVar9 = SEQ_UNPADDED;
      if (index_hash->remaining == 0) {
        aVar9 = SEQ_PADDING_INIT;
      }
      index_hash->sequence = aVar9;
      break;
    case SEQ_UNPADDED:
    case SEQ_UNCOMPRESSED:
      if (index_hash->sequence == SEQ_UNPADDED) {
        local_60 = &index_hash->unpadded_size;
      }
      else {
        local_60 = &index_hash->uncompressed_size;
      }
      size._4_4_ = lzma_vli_decode(local_60,&index_hash->pos,in,in_pos,in_size);
      if (size._4_4_ != LZMA_STREAM_END) {
LAB_0024650f:
        uVar6 = lzma_crc32(in + sVar2,*in_pos - sVar2,index_hash->crc32);
        index_hash->crc32 = uVar6;
        return size._4_4_;
      }
      index_hash->pos = 0;
      if (index_hash->sequence == SEQ_UNPADDED) {
        if ((index_hash->unpadded_size < 5) || (0x7ffffffffffffffc < index_hash->unpadded_size)) {
          return LZMA_DATA_ERROR;
        }
        index_hash->sequence = SEQ_UNCOMPRESSED;
      }
      else {
        lVar4 = hash_append(&index_hash->records,index_hash->unpadded_size,
                            index_hash->uncompressed_size);
        if (lVar4 != LZMA_OK) {
          return lVar4;
        }
        if ((((index_hash->blocks).blocks_size < (index_hash->records).blocks_size) ||
            ((index_hash->blocks).uncompressed_size < (index_hash->records).uncompressed_size)) ||
           ((index_hash->blocks).index_list_size < (index_hash->records).index_list_size)) {
          return LZMA_DATA_ERROR;
        }
        lVar7 = index_hash->remaining - 1;
        index_hash->remaining = lVar7;
        aVar9 = SEQ_UNPADDED;
        if (lVar7 == 0) {
          aVar9 = SEQ_PADDING_INIT;
        }
        index_hash->sequence = aVar9;
      }
      break;
    case SEQ_PADDING_INIT:
      lVar7 = index_size_unpadded((index_hash->records).count,(index_hash->records).index_list_size)
      ;
      index_hash->pos = 4 - lVar7 & 3;
      index_hash->sequence = SEQ_PADDING;
    case SEQ_PADDING:
      if (index_hash->pos == 0) {
        if ((((index_hash->blocks).blocks_size != (index_hash->records).blocks_size) ||
            ((index_hash->blocks).uncompressed_size != (index_hash->records).uncompressed_size)) ||
           ((index_hash->blocks).index_list_size != (index_hash->records).index_list_size)) {
          return LZMA_DATA_ERROR;
        }
        lzma_check_finish(&(index_hash->blocks).check,LZMA_CHECK_SHA256);
        lzma_check_finish(&(index_hash->records).check,LZMA_CHECK_SHA256);
        uVar6 = lzma_check_size(LZMA_CHECK_SHA256);
        iVar5 = memcmp(&(index_hash->blocks).check,&(index_hash->records).check,(ulong)uVar6);
        if (iVar5 != 0) {
          return LZMA_DATA_ERROR;
        }
        uVar6 = lzma_crc32(in + sVar2,*in_pos - sVar2,index_hash->crc32);
        index_hash->crc32 = uVar6;
        index_hash->sequence = SEQ_CRC32;
switchD_0024608a_caseD_6:
        while( true ) {
          if (*in_pos == in_size) {
            return LZMA_OK;
          }
          uVar1 = index_hash->crc32;
          sVar2 = index_hash->pos;
          sVar3 = *in_pos;
          *in_pos = sVar3 + 1;
          if ((uVar1 >> ((byte)(sVar2 << 3) & 0x1f) & 0xff) != (uint)in[sVar3]) break;
          uVar8 = index_hash->pos + 1;
          index_hash->pos = uVar8;
          if (3 < uVar8) {
            return LZMA_STREAM_END;
          }
        }
        return LZMA_DATA_ERROR;
      }
      index_hash->pos = index_hash->pos - 1;
      sVar3 = *in_pos;
      *in_pos = sVar3 + 1;
      if (in[sVar3] != '\0') {
        return LZMA_DATA_ERROR;
      }
      break;
    case SEQ_CRC32:
      goto switchD_0024608a_caseD_6;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/index_hash.c"
                    ,0x144,
                    "lzma_ret lzma_index_hash_decode(lzma_index_hash *, const uint8_t *, size_t *, size_t)"
                   );
    }
  } while( true );
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_hash_decode(lzma_index_hash *index_hash, const uint8_t *in,
		size_t *in_pos, size_t in_size)
{
	// Catch zero input buffer here, because in contrast to Index encoder
	// and decoder functions, applications call this function directly
	// instead of via lzma_code(), which does the buffer checking.
	if (*in_pos >= in_size)
		return LZMA_BUF_ERROR;

	// NOTE: This function has many similarities to index_encode() and
	// index_decode() functions found from index_encoder.c and
	// index_decoder.c. See the comments especially in index_encoder.c.
	const size_t in_start = *in_pos;
	lzma_ret ret = LZMA_OK;

	while (*in_pos < in_size)
	switch (index_hash->sequence) {
	case SEQ_BLOCK:
		// Check the Index Indicator is present.
		if (in[(*in_pos)++] != 0x00)
			return LZMA_DATA_ERROR;

		index_hash->sequence = SEQ_COUNT;
		break;

	case SEQ_COUNT: {
		ret = lzma_vli_decode(&index_hash->remaining,
				&index_hash->pos, in, in_pos, in_size);
		if (ret != LZMA_STREAM_END)
			goto out;

		// The count must match the count of the Blocks decoded.
		if (index_hash->remaining != index_hash->blocks.count)
			return LZMA_DATA_ERROR;

		ret = LZMA_OK;
		index_hash->pos = 0;

		// Handle the special case when there are no Blocks.
		index_hash->sequence = index_hash->remaining == 0
				? SEQ_PADDING_INIT : SEQ_UNPADDED;
		break;
	}

	case SEQ_UNPADDED:
	case SEQ_UNCOMPRESSED: {
		lzma_vli *size = index_hash->sequence == SEQ_UNPADDED
				? &index_hash->unpadded_size
				: &index_hash->uncompressed_size;

		ret = lzma_vli_decode(size, &index_hash->pos,
				in, in_pos, in_size);
		if (ret != LZMA_STREAM_END)
			goto out;

		ret = LZMA_OK;
		index_hash->pos = 0;

		if (index_hash->sequence == SEQ_UNPADDED) {
			if (index_hash->unpadded_size < UNPADDED_SIZE_MIN
					|| index_hash->unpadded_size
						> UNPADDED_SIZE_MAX)
				return LZMA_DATA_ERROR;

			index_hash->sequence = SEQ_UNCOMPRESSED;
		} else {
			// Update the hash.
			return_if_error(hash_append(&index_hash->records,
					index_hash->unpadded_size,
					index_hash->uncompressed_size));

			// Verify that we don't go over the known sizes. Note
			// that this validation is simpler than the one used
			// in lzma_index_hash_append(), because here we know
			// that values in index_hash->blocks are already
			// validated and we are fine as long as we don't
			// exceed them in index_hash->records.
			if (index_hash->blocks.blocks_size
					< index_hash->records.blocks_size
					|| index_hash->blocks.uncompressed_size
					< index_hash->records.uncompressed_size
					|| index_hash->blocks.index_list_size
					< index_hash->records.index_list_size)
				return LZMA_DATA_ERROR;

			// Check if this was the last Record.
			index_hash->sequence = --index_hash->remaining == 0
					? SEQ_PADDING_INIT : SEQ_UNPADDED;
		}

		break;
	}

	case SEQ_PADDING_INIT:
		index_hash->pos = (LZMA_VLI_C(4) - index_size_unpadded(
				index_hash->records.count,
				index_hash->records.index_list_size)) & 3;
		index_hash->sequence = SEQ_PADDING;

	// Fall through

	case SEQ_PADDING:
		if (index_hash->pos > 0) {
			--index_hash->pos;
			if (in[(*in_pos)++] != 0x00)
				return LZMA_DATA_ERROR;

			break;
		}

		// Compare the sizes.
		if (index_hash->blocks.blocks_size
				!= index_hash->records.blocks_size
				|| index_hash->blocks.uncompressed_size
				!= index_hash->records.uncompressed_size
				|| index_hash->blocks.index_list_size
				!= index_hash->records.index_list_size)
			return LZMA_DATA_ERROR;

		// Finish the hashes and compare them.
		lzma_check_finish(&index_hash->blocks.check, LZMA_CHECK_BEST);
		lzma_check_finish(&index_hash->records.check, LZMA_CHECK_BEST);
		if (memcmp(index_hash->blocks.check.buffer.u8,
				index_hash->records.check.buffer.u8,
				lzma_check_size(LZMA_CHECK_BEST)) != 0)
			return LZMA_DATA_ERROR;

		// Finish the CRC32 calculation.
		index_hash->crc32 = lzma_crc32(in + in_start,
				*in_pos - in_start, index_hash->crc32);

		index_hash->sequence = SEQ_CRC32;

	// Fall through

	case SEQ_CRC32:
		do {
			if (*in_pos == in_size)
				return LZMA_OK;

			if (((index_hash->crc32 >> (index_hash->pos * 8))
					& 0xFF) != in[(*in_pos)++])
				return LZMA_DATA_ERROR;

		} while (++index_hash->pos < 4);

		return LZMA_STREAM_END;

	default:
		assert(0);
		return LZMA_PROG_ERROR;
	}

out:
	// Update the CRC32,
	index_hash->crc32 = lzma_crc32(in + in_start,
			*in_pos - in_start, index_hash->crc32);

	return ret;
}